

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Sched.c
# Opt level: O0

void Llb_MtrSwapColumns(Llb_Mtr_t *p,int iCol1,int iCol2)

{
  int iVar1;
  Llb_Grp_t *pLVar2;
  char *pcVar3;
  int iTemp;
  char *pTemp;
  Llb_Grp_t *pGemp;
  int iCol2_local;
  int iCol1_local;
  Llb_Mtr_t *p_local;
  
  if ((iCol1 < 0) || (p->nCols <= iCol1)) {
    __assert_fail("iCol1 >= 0 && iCol1 < p->nCols",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Sched.c"
                  ,0x32,"void Llb_MtrSwapColumns(Llb_Mtr_t *, int, int)");
  }
  if ((-1 < iCol2) && (iCol2 < p->nCols)) {
    if (iCol1 != iCol2) {
      if (iCol1 == iCol2) {
        __assert_fail("iCol1 != iCol2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Sched.c"
                      ,0x36,"void Llb_MtrSwapColumns(Llb_Mtr_t *, int, int)");
      }
      pLVar2 = p->pColGrps[iCol1];
      p->pColGrps[iCol1] = p->pColGrps[iCol2];
      p->pColGrps[iCol2] = pLVar2;
      pcVar3 = p->pMatrix[iCol1];
      p->pMatrix[iCol1] = p->pMatrix[iCol2];
      p->pMatrix[iCol2] = pcVar3;
      iVar1 = p->pColSums[iCol1];
      p->pColSums[iCol1] = p->pColSums[iCol2];
      p->pColSums[iCol2] = iVar1;
    }
    return;
  }
  __assert_fail("iCol2 >= 0 && iCol2 < p->nCols",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Sched.c"
                ,0x33,"void Llb_MtrSwapColumns(Llb_Mtr_t *, int, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Swaps two rows.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Llb_MtrSwapColumns( Llb_Mtr_t * p, int iCol1, int iCol2 )
{
    Llb_Grp_t * pGemp;
    char * pTemp;
    int iTemp;
    assert( iCol1 >= 0 && iCol1 < p->nCols );
    assert( iCol2 >= 0 && iCol2 < p->nCols );
    if ( iCol1 == iCol2 )
        return;
    assert( iCol1 != iCol2 );
    // swap col groups
    pGemp = p->pColGrps[iCol1];
    p->pColGrps[iCol1] = p->pColGrps[iCol2];
    p->pColGrps[iCol2] = pGemp;
    // swap col vectors
    pTemp = p->pMatrix[iCol1];
    p->pMatrix[iCol1] = p->pMatrix[iCol2];
    p->pMatrix[iCol2] = pTemp;
    // swap col sums
    iTemp = p->pColSums[iCol1];
    p->pColSums[iCol1] = p->pColSums[iCol2];
    p->pColSums[iCol2] = iTemp;
}